

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_3::getNumShaderBlocks(Shader *shader,Storage storage)

{
  pointer pIVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  pIVar1 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(shader->m_defaultBlock).interfaceBlocks.
                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x90;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
  }
  iVar5 = 0;
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    if (pIVar1[uVar3].storage == storage) {
      lVar2 = *(long *)&pIVar1[uVar3].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data;
      uVar7 = (ulong)((long)*(pointer *)
                             ((long)&pIVar1[uVar3].dimensions.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                     lVar2) >> 2;
      uVar8 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar8 = 0;
      }
      iVar6 = 1;
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        iVar6 = iVar6 * *(int *)(lVar2 + uVar7 * 4);
      }
      iVar5 = iVar5 + iVar6;
    }
  }
  return iVar5;
}

Assistant:

static int getNumShaderBlocks (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage)
{
	int retVal = 0;

	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		if (shader->getDefaultBlock().interfaceBlocks[ndx].storage == storage)
		{
			int numInstances = 1;

			for (int dimensionNdx = 0; dimensionNdx < (int)shader->getDefaultBlock().interfaceBlocks[ndx].dimensions.size(); ++dimensionNdx)
				numInstances *= shader->getDefaultBlock().interfaceBlocks[ndx].dimensions[dimensionNdx];

			retVal += numInstances;
		}
	}

	return retVal;
}